

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_data.c
# Opt level: O0

fio_str_info_s *
fiobj_data_pread_file
          (fio_str_info_s *__return_storage_ptr__,FIOBJ io,intptr_t start_at,uintptr_t length)

{
  ulong uVar1;
  size_t sVar2;
  ssize_t tmp;
  int64_t size;
  uintptr_t length_local;
  intptr_t start_at_local;
  FIOBJ io_local;
  
  uVar1 = fiobj_data_get_fd_size(io);
  length_local = start_at;
  if (start_at < 0) {
    length_local = uVar1 + start_at;
  }
  if ((long)length_local < 0) {
    length_local = 0;
  }
  size = length;
  if (uVar1 < length + length_local) {
    size = uVar1 - length_local;
  }
  if (size == 0) {
    *(undefined8 *)(io + 0x18) = 0;
    fio_free(*(void **)(io + 8));
    *(undefined8 *)(io + 8) = 0;
    memset(__return_storage_ptr__,0,0x18);
  }
  else {
    *(undefined8 *)(io + 0x20) = 0;
    *(undefined8 *)(io + 0x28) = 0;
    fiobj_data_pre_write(io,size + 1);
    sVar2 = pread(*(int *)(io + 0x30),*(void **)(io + 8),size,length_local);
    if ((long)sVar2 < 1) {
      memset(__return_storage_ptr__,0,0x18);
    }
    else {
      *(undefined1 *)(*(long *)(io + 8) + sVar2) = 0;
      __return_storage_ptr__->capa = 0;
      __return_storage_ptr__->len = sVar2;
      __return_storage_ptr__->data = *(char **)(io + 8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static fio_str_info_s fiobj_data_pread_file(FIOBJ io, intptr_t start_at,
                                            uintptr_t length) {
  const int64_t size = fiobj_data_get_fd_size(io);
  if (start_at < 0)
    start_at = size + start_at;
  if (start_at < 0)
    start_at = 0;
  if (length + start_at > (uint64_t)size)
    length = size - start_at;
  if (length == 0) {
    /* free memory once there's no more data to read */
    obj2io(io)->capa = 0;
    fio_free(obj2io(io)->buffer);
    obj2io(io)->buffer = NULL;
    return (fio_str_info_s){
        .data = NULL,
        .len = 0,
    };
  }
  obj2io(io)->len = 0;
  obj2io(io)->pos = 0;
  fiobj_data_pre_write(io, length + 1);
  ssize_t tmp = pread(obj2io(io)->fd, obj2io(io)->buffer, length, start_at);
  if (tmp <= 0) {
    return (fio_str_info_s){
        .data = NULL,
        .len = 0,
    };
  }
  obj2io(io)->buffer[tmp] = 0;
  return (fio_str_info_s){
      .data = (char *)obj2io(io)->buffer,
      .len = tmp,
  };
}